

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tri_edge.cpp
# Opt level: O3

void __thiscall tri_cc_geom_t::clear(tri_cc_geom_t *this)

{
  shared_count sStack_10;
  
  sStack_10.pi_ = (this->m_tri_cc).pn.pi_;
  (this->m_tri_cc).px = (element_type *)0x0;
  (this->m_tri_cc).pn.pi_ = (sp_counted_base *)0x0;
  boost::detail::shared_count::~shared_count(&sStack_10);
  if (*(long *)&this->field_0x18 != *(long *)&this->m_cell_pos) {
    *(long *)&this->field_0x18 = *(long *)&this->m_cell_pos;
  }
  if (*(long *)&this->field_0x30 != *(long *)&this->m_cell_normal) {
    *(long *)&this->field_0x30 = *(long *)&this->m_cell_normal;
  }
  return;
}

Assistant:

void tri_cc_geom_t::clear()
{
  m_tri_cc.reset();

  m_cell_pos.clear();

  m_cell_normal.clear();
}